

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  interval_t *idata;
  AggregateUnaryInput input_data;
  SelectionVector *local_70;
  interval_t *local_68;
  ValidityMask local_60;
  
  if (*this != (AggregateExecutor)0x0) {
    if (*this == (AggregateExecutor)0x2) {
      if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
        local_68 = (interval_t *)(this + 0x28);
        local_60.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
        local_70 = (SelectionVector *)input;
        BaseSumOperation<duckdb::AverageSetOperation,duckdb::IntervalAdd>::
        ConstantOperation<duckdb::interval_t,duckdb::IntervalAvgState,duckdb::IntervalAverageOperation>
                  ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::IntervalAdd> *)
                   aggr_input_data,*(IntervalAvgState **)(this + 0x20),(interval_t *)&local_70,
                   (AggregateUnaryInput *)state,count);
      }
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
      duckdb::Vector::ToUnifiedFormat((ulong)this,(UnifiedVectorFormat *)state);
      UnaryUpdateLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
                (local_68,(AggregateInputData *)input,(IntervalAvgState *)aggr_input_data,
                 (idx_t)state,&local_60,local_70);
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    }
    return;
  }
  idata = *(interval_t **)(this + 0x20);
  FlatVector::VerifyFlatVector((Vector *)this);
  UnaryFlatUpdateLoop<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
            (idata,(AggregateInputData *)input,(IntervalAvgState *)aggr_input_data,(idx_t)state,
             (ValidityMask *)(this + 0x28));
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}